

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmberImproperTorsionType.hpp
# Opt level: O0

ostream * OpenMD::operator<<(ostream *os,AmberImproperTorsionType *ott)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"This AmberImproperTorsionType has below form:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = (ostream *)std::ostream::operator<<(in_RDI,*(double *)(in_RSI + 0x38));
  poVar1 = std::operator<<(poVar1,"/2*(1-cos(2*(phi-phi0)))");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, AmberImproperTorsionType& ott) {
    os << "This AmberImproperTorsionType has below form:" << std::endl;
    os << ott.v2_ << "/2*(1-cos(2*(phi-phi0)))" << std::endl;
    return os;
  }